

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O2

void out_AddSection(Section *section)

{
  SectionType SVar1;
  uint uVar2;
  uint32_t uVar3;
  SortedSection *pSVar4;
  SortedSections *pSVar5;
  SortedSection *pSVar6;
  ulong uVar7;
  SortedSections *pSVar8;
  uint uVar9;
  
  SVar1 = section->type;
  uVar2 = section->bank;
  uVar3 = sectionTypeInfo[SVar1].firstBank;
  uVar9 = (uVar2 - uVar3) + 1;
  if (out_AddSection::maxNbBanks[SVar1] < uVar9) {
    errx("Section \"%s\" has an invalid bank range (%u > %u)",section->name,(ulong)uVar2,
         (ulong)(out_AddSection::maxNbBanks[SVar1] - 1));
  }
  if (sections[SVar1].nbBanks < uVar9) {
    pSVar5 = (SortedSections *)realloc(sections[SVar1].banks,(ulong)uVar9 << 4);
    SVar1 = section->type;
    sections[SVar1].banks = pSVar5;
    uVar7 = (ulong)sections[SVar1].nbBanks;
    pSVar8 = pSVar5 + uVar7;
    for (; uVar7 < uVar9; uVar7 = uVar7 + 1) {
      pSVar8->sections = (SortedSection *)0x0;
      pSVar8->zeroLenSections = (SortedSection *)0x0;
      pSVar8 = pSVar8 + 1;
    }
    sections[SVar1].nbBanks = uVar9;
  }
  else {
    pSVar5 = sections[SVar1].banks;
  }
  if (pSVar5 != (SortedSections *)0x0) {
    pSVar6 = (SortedSection *)malloc(0x10);
    if (pSVar6 != (SortedSection *)0x0) {
      pSVar8 = (SortedSections *)&pSVar5->zeroLenSections;
      if (section->size != 0) {
        pSVar8 = pSVar5;
      }
      pSVar8 = pSVar8 + (uVar2 - uVar3);
      pSVar6->section = section;
      while ((pSVar4 = pSVar8->sections, pSVar4 != (SortedSection *)0x0 &&
             (pSVar4->section->org < section->org))) {
        pSVar8 = (SortedSections *)&pSVar4->next;
      }
      pSVar6->next = pSVar4;
      pSVar8->sections = pSVar6;
      return;
    }
    err("Failed to add new section \"%s\"",section->name);
  }
  err("Failed to realloc banks");
}

Assistant:

void out_AddSection(struct Section const *section)
{
	static uint32_t maxNbBanks[] = {
		AT(SECTTYPE_WRAM0) 1,
		AT(SECTTYPE_VRAM)  2,
		AT(SECTTYPE_ROMX)  UINT32_MAX,
		AT(SECTTYPE_ROM0)  1,
		AT(SECTTYPE_HRAM)  1,
		AT(SECTTYPE_WRAMX) 7,
		AT(SECTTYPE_SRAM)  UINT32_MAX,
		AT(SECTTYPE_OAM)   1,
	};

	uint32_t targetBank = section->bank - sectionTypeInfo[section->type].firstBank;
	uint32_t minNbBanks = targetBank + 1;

	if (minNbBanks > maxNbBanks[section->type])
		errx("Section \"%s\" has an invalid bank range (%" PRIu32 " > %" PRIu32 ")",
		     section->name, section->bank,
		     maxNbBanks[section->type] - 1);

	if (minNbBanks > sections[section->type].nbBanks) {
		sections[section->type].banks =
			(struct SortedSections *)realloc(sections[section->type].banks,
				sizeof(*sections[0].banks) * minNbBanks);
		for (uint32_t i = sections[section->type].nbBanks; i < minNbBanks; i++) {
			sections[section->type].banks[i].sections = NULL;
			sections[section->type].banks[i].zeroLenSections = NULL;
		}
		sections[section->type].nbBanks = minNbBanks;
	}
	if (!sections[section->type].banks)
		err("Failed to realloc banks");

	struct SortedSection *newSection = (struct SortedSection *)malloc(sizeof(*newSection));
	struct SortedSection **ptr = section->size
		? &sections[section->type].banks[targetBank].sections
		: &sections[section->type].banks[targetBank].zeroLenSections;

	if (!newSection)
		err("Failed to add new section \"%s\"", section->name);
	newSection->section = section;

	while (*ptr && (*ptr)->section->org < section->org)
		ptr = &(*ptr)->next;

	newSection->next = *ptr;
	*ptr = newSection;
}